

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow *window)

{
  ImGuiWindow *in_RDI;
  ImVec2 IVar1;
  ImVec2 size_auto_fit;
  ImVec2 size_contents_ideal;
  ImVec2 size_contents_current;
  ImVec2 size_final;
  ImVec2 *in_stack_00000070;
  ImGuiWindow *in_stack_00000078;
  ImVec2 in_stack_ffffffffffffffe0;
  ImVec2 in_stack_ffffffffffffffe8;
  
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe8);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0);
  CalcWindowContentSizes
            (in_RDI,(ImVec2 *)in_stack_ffffffffffffffe8,(ImVec2 *)in_stack_ffffffffffffffe0);
  CalcWindowAutoFitSize(in_stack_00000078,in_stack_00000070);
  IVar1 = CalcWindowSizeAfterConstraint(window,(ImVec2 *)size_contents_current);
  return IVar1;
}

Assistant:

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow* window)
{
    ImVec2 size_contents_current;
    ImVec2 size_contents_ideal;
    CalcWindowContentSizes(window, &size_contents_current, &size_contents_ideal);
    ImVec2 size_auto_fit = CalcWindowAutoFitSize(window, size_contents_ideal);
    ImVec2 size_final = CalcWindowSizeAfterConstraint(window, size_auto_fit);
    return size_final;
}